

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

void __thiscall
asmjit::JitAllocatorBlock::markShrunkArea
          (JitAllocatorBlock *this,uint32_t shrunkAreaStart,uint32_t shrunkAreaEnd)

{
  size_t *psVar1;
  BitWord *pBVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  byte bVar10;
  uint32_t uVar11;
  CreateParams *pCVar12;
  CreateParams *pCVar13;
  uint uVar14;
  ulong uVar15;
  CreateParams *pCVar16;
  CreateParams *pCVar17;
  ulong uVar18;
  byte *pbVar19;
  ulong uVar20;
  undefined4 in_register_00000034;
  CreateParams *params;
  ulong *puVar21;
  ulong uVar22;
  CreateParams *pCVar23;
  byte *pbVar24;
  uint uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong uVar28;
  uint32_t *puVar29;
  ulong *puVar30;
  undefined1 auStack_e8 [16];
  ulong uStack_d8;
  ulong uStack_d0;
  JitAllocatorBlock *pJStack_c8;
  undefined1 auStack_80 [24];
  
  params = (CreateParams *)CONCAT44(in_register_00000034,shrunkAreaStart);
  if (shrunkAreaStart == 0) {
    markShrunkArea();
  }
  else {
    uVar25 = shrunkAreaEnd - shrunkAreaStart;
    uVar26 = (ulong)uVar25;
    if (uVar25 != 0) {
      psVar1 = &this->_pool->totalAreaUsed;
      *psVar1 = *psVar1 - uVar26;
      this->_areaUsed = this->_areaUsed - uVar25;
      uVar25 = this->_searchStart;
      if (shrunkAreaStart < this->_searchStart) {
        uVar25 = shrunkAreaStart;
      }
      uVar14 = this->_searchEnd;
      if (this->_searchEnd <= shrunkAreaEnd) {
        uVar14 = shrunkAreaEnd;
      }
      this->_searchStart = uVar25;
      this->_searchEnd = uVar14;
      pBVar2 = this->_usedBitVector;
      uVar18 = 0x40 - (ulong)(shrunkAreaStart & 0x3f);
      if (uVar26 < uVar18) {
        uVar18 = uVar26;
      }
      puVar30 = pBVar2 + (shrunkAreaStart >> 6);
      puVar27 = puVar30 + 1;
      *puVar30 = *puVar30 &
                 ~((0xffffffffffffffffU >> (-(char)uVar18 & 0x3fU)) <<
                  (sbyte)(shrunkAreaStart & 0x3f));
      uVar15 = uVar26 - uVar18;
      if (0x3f < uVar15) {
        uVar26 = (uVar26 - uVar18) - 0x40;
        uVar18 = uVar26 >> 6;
        memset(puVar27,0,uVar18 * 8 + 8);
        uVar15 = (ulong)((uint)uVar26 & 0x3f);
        puVar27 = pBVar2 + uVar18 + (shrunkAreaStart >> 6) + 2;
      }
      if (uVar15 != 0) {
        *puVar27 = *puVar27 & ~(0xffffffffffffffffU >> (-(char)uVar15 & 0x3fU));
      }
      pBVar2 = this->_stopBitVector;
      bVar10 = (byte)(shrunkAreaEnd - 1) & 0x3f;
      puVar30 = pBVar2 + (shrunkAreaEnd - 1 >> 6);
      *puVar30 = *puVar30 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
      puVar30 = pBVar2 + (shrunkAreaStart - 1 >> 6);
      *puVar30 = *puVar30 | 1L << ((byte)(shrunkAreaStart - 1) & 0x3f);
      *(byte *)&this->_flags = (byte)this->_flags | 2;
      return;
    }
  }
  markShrunkArea();
  uVar26._0_4_ = params->options;
  uVar26._4_4_ = params->blockSize;
  if (uVar26 < 2) {
    lVar3._0_4_ = params->granularity;
    lVar3._4_4_ = params->fillPattern;
    if (lVar3 != 0) goto LAB_0011baf3;
    if (uVar26 == 0) {
      pCVar17 = (CreateParams *)
                (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                _rbNodeData[0];
      if (pCVar17 == (CreateParams *)0x0) {
        (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
             (uintptr_t)params;
      }
      else {
        pCVar12 = (CreateParams *)auStack_80;
        auStack_80._0_4_ = 0;
        auStack_80._4_4_ = 0;
        auStack_80._8_8_ = pCVar17;
        params->options = 1;
        params->blockSize = 0;
        pCVar13 = (CreateParams *)0x0;
        uVar26 = 0;
        pCVar23 = (CreateParams *)0x0;
        uVar18 = 0;
        while( true ) {
          if (pCVar17 == (CreateParams *)0x0) {
            *(ulong *)(&pCVar23->options + uVar18 * 2) =
                 (ulong)((uint)*(undefined8 *)(&pCVar23->options + uVar18 * 2) & 1) | (ulong)params;
            pCVar16 = params;
          }
          else {
            uVar15._0_4_ = pCVar17->options;
            uVar15._4_4_ = pCVar17->blockSize;
            pbVar24 = (byte *)(uVar15 & 0xfffffffffffffffe);
            pCVar16 = pCVar17;
            if ((((pbVar24 != (byte *)0x0) && ((*pbVar24 & 1) != 0)) &&
                (*(byte **)&pCVar17->granularity != (byte *)0x0)) &&
               ((**(byte **)&pCVar17->granularity & 1) != 0)) {
              pCVar17->options = (int)(uVar15 | 1);
              pCVar17->blockSize = (int)((uVar15 | 1) >> 0x20);
              *pbVar24 = *pbVar24 & 0xfe;
              **(ulong **)&pCVar17->granularity =
                   **(ulong **)&pCVar17->granularity & 0xfffffffffffffffe;
            }
          }
          if (((pCVar23 != (CreateParams *)0x0) &&
              (((undefined1  [16])*pCVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) &&
             ((pCVar23->options & 1) != 0)) {
            pCVar17 = *(CreateParams **)&pCVar12->granularity;
            uVar15 = (ulong)(uVar26 == 0);
            bVar9 = uVar26 != 0;
            uVar28 = (ulong)bVar9;
            pbVar24 = (byte *)(*(ulong *)(&pCVar13->options + uVar28 * 2) & 0xfffffffffffffffe);
            if (pCVar16 ==
                (CreateParams *)(*(ulong *)(&pCVar23->options + uVar26 * 2) & 0xfffffffffffffffe)) {
              puVar30 = (ulong *)(pbVar24 + uVar15 * 8);
              uVar26 = (ulong)((uint)*(ulong *)(&pCVar13->options + uVar28 * 2) & 1) |
                       *puVar30 & 0xfffffffffffffffe;
            }
            else {
              pbVar19 = (byte *)(*(ulong *)(pbVar24 + (ulong)(uVar26 == 0) * 8) & 0xfffffffffffffffe
                                );
              uVar22 = (ulong)((uint)bVar9 * 8);
              *(ulong *)(pbVar24 + (ulong)(uVar26 == 0) * 8) =
                   (ulong)((uint)*(ulong *)(pbVar24 + (ulong)(uVar26 == 0) * 8) & 1) |
                   *(ulong *)(pbVar19 + uVar22) & 0xfffffffffffffffe;
              *(ulong *)(pbVar19 + uVar22) =
                   (ulong)((uint)*(undefined8 *)(pbVar19 + uVar22) & 1) | (ulong)pbVar24;
              *pbVar24 = *pbVar24 | 1;
              *pbVar19 = *pbVar19 & 0xfe;
              uVar26 = (ulong)((uint)*(undefined8 *)((long)&pCVar13->options + uVar22) & 1);
              *(byte **)((long)&pCVar13->options + uVar22) = pbVar19 + uVar26;
              puVar30 = (ulong *)(pbVar19 + uVar15 * 8);
              uVar26 = *puVar30 & 0xfffffffffffffffe | uVar26;
              pbVar24 = pbVar19;
            }
            *(ulong *)(&pCVar13->options + uVar28 * 2) = uVar26;
            *puVar30 = (ulong)((uint)*puVar30 & 1) | (ulong)pCVar13;
            *(byte *)&pCVar13->options = (byte)pCVar13->options | 1;
            uVar26 = (ulong)(pCVar13 == pCVar17);
            *pbVar24 = *pbVar24 & 0xfe;
            *(ulong *)(&pCVar12->options + uVar26 * 2) =
                 (ulong)((uint)*(undefined8 *)(&pCVar12->options + uVar26 * 2) & 1) | (ulong)pbVar24
            ;
          }
          if (pCVar16 == params) break;
          uVar28._0_4_ = pCVar16[2].granularity;
          uVar28._4_4_ = pCVar16[2].fillPattern;
          uVar22._0_4_ = params[2].granularity;
          uVar22._4_4_ = params[2].fillPattern;
          if (pCVar13 != (CreateParams *)0x0) {
            pCVar12 = pCVar13;
          }
          pCVar17 = (CreateParams *)
                    (*(ulong *)(&pCVar16->options + (ulong)(uVar28 < uVar22) * 2) &
                    0xfffffffffffffffe);
          pCVar13 = pCVar23;
          uVar26 = uVar18;
          pCVar23 = pCVar16;
          uVar18 = (ulong)(uVar28 < uVar22);
        }
        (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
             auStack_80._8_8_;
        *(byte *)(uint32_t *)auStack_80._8_8_ = (byte)*(uint32_t *)auStack_80._8_8_ & 0xfe;
      }
      return;
    }
  }
  else {
    ZoneTree<asmjit::JitAllocatorBlock>::insert<asmjit::Support::Compare<0u>>();
LAB_0011baf3:
    ZoneTree<asmjit::JitAllocatorBlock>::insert<asmjit::Support::Compare<0u>>();
  }
  ZoneTree<asmjit::JitAllocatorBlock>::insert<asmjit::Support::Compare<0u>>();
  pCVar17 = (CreateParams *)auStack_e8;
  auStack_e8._0_4_ = 0;
  auStack_e8._4_4_ = 0;
  pJStack_c8 = this;
  pbVar24 = (byte *)(this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                    _rbNodeData[0];
  auStack_e8._8_8_ = pbVar24;
  if (pbVar24 < (byte *)0x2) {
    pCVar12 = (CreateParams *)0x0;
    pCVar13 = (CreateParams *)0x0;
    pCVar23 = (CreateParams *)0x0;
  }
  else {
    puVar29 = (uint32_t *)(auStack_e8 + 8);
    uVar18._0_4_ = params[2].granularity;
    uVar18._4_4_ = params[2].fillPattern;
    pCVar13 = (CreateParams *)0x0;
    pCVar12 = (CreateParams *)0x0;
    uStack_d0 = uVar18;
    uVar26 = 1;
    pCVar17 = (CreateParams *)auStack_e8;
    pCVar16 = (CreateParams *)0x0;
    do {
      pCVar23 = pCVar17;
      pCVar17 = (CreateParams *)((ulong)pbVar24 & 0xfffffffffffffffe);
      uVar20._0_4_ = pCVar17[2].granularity;
      uVar20._4_4_ = pCVar17[2].fillPattern;
      uVar25 = (uint)(uVar18 < uVar20) - (uint)(uVar20 < uVar18);
      uVar15 = (ulong)(uVar25 >> 0x1f);
      if (pCVar17 == params) {
        pCVar13 = pCVar17;
        pCVar12 = pCVar16;
      }
      if (((pCVar17 == (CreateParams *)0x0) || ((pCVar17->options & 1) == 0)) &&
         ((this = (JitAllocatorBlock *)
                  (*(ulong *)(&pCVar17->options + uVar15 * 2) & 0xfffffffffffffffe),
          this == (JitAllocatorBlock *)0x0 ||
          (((this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0]
           & 1) == 0)))) {
        uVar28 = (ulong)(~uVar25 >> 0x1f);
        this = (JitAllocatorBlock *)
               (*(ulong *)(&pCVar17->options + uVar28 * 2) & 0xfffffffffffffffe);
        if (this == (JitAllocatorBlock *)0x0) {
LAB_0011bbb8:
          uVar28 = (ulong)(uVar26 == 0);
          puVar30 = (ulong *)(*(ulong *)(&pCVar23->options + uVar28 * 2) & 0xfffffffffffffffe);
          if (puVar30 != (ulong *)0x0) {
            this = (JitAllocatorBlock *)(puVar30[uVar28] & 0xfffffffffffffffe);
            if (((this == (JitAllocatorBlock *)0x0) ||
                (((this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                  _rbNodeData[0] & 1) == 0)) &&
               (((byte *)(puVar30[uVar26] & 0xfffffffffffffffe) == (byte *)0x0 ||
                ((*(byte *)(puVar30[uVar26] & 0xfffffffffffffffe) & 1) == 0)))) {
              *(byte *)&pCVar23->options = (byte)pCVar23->options & 0xfe;
              *(byte *)puVar30 = (byte)*puVar30 | 1;
              *(byte *)&pCVar17->options = (byte)pCVar17->options | 1;
            }
            else {
              uVar18 = (ulong)(pCVar23 == *(CreateParams **)&pCVar16->granularity);
              pbVar24 = (byte *)(puVar30[uVar26] & 0xfffffffffffffffe);
              if ((pbVar24 == (byte *)0x0) || ((*pbVar24 & 1) == 0)) {
                puVar27 = (ulong *)(*(ulong *)(&pCVar16->options + uVar18 * 2) & 0xfffffffffffffffe)
                ;
                if ((this != (JitAllocatorBlock *)0x0) &&
                   (((this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                     _rbNodeData[0] & 1) != 0)) {
                  puVar21 = puVar30 + uVar26;
                  uVar22 = (ulong)pbVar24 |
                           (ulong)((uint)*(ulong *)(&pCVar23->options + uVar28 * 2) & 1);
                  puVar27 = puVar30;
                  goto LAB_0011bd04;
                }
              }
              else {
                uStack_d8 = (ulong)(uVar26 != 0);
                puVar27 = (ulong *)(puVar30[uStack_d8] & 0xfffffffffffffffe);
                uVar20 = (ulong)((uint)(uVar26 == 0) * 8);
                puVar30[uStack_d8] =
                     (ulong)((uint)puVar30[uStack_d8] & 1) |
                     *(ulong *)((long)puVar27 + uVar20) & 0xfffffffffffffffe;
                *(ulong *)((long)puVar27 + uVar20) =
                     (ulong)((uint)*(undefined8 *)((long)puVar27 + uVar20) & 1) | (ulong)puVar30;
                *(byte *)puVar30 = (byte)*puVar30 | 1;
                *(byte *)puVar27 = (byte)*puVar27 & 0xfe;
                uVar22 = (ulong)((uint)*(undefined8 *)((long)&pCVar23->options + uVar20) & 1);
                *(byte **)((long)&pCVar23->options + uVar20) = (byte *)(uVar22 + (long)puVar27);
                puVar21 = puVar27 + uVar26;
                uVar22 = *puVar21 & 0xfffffffffffffffe | uVar22;
LAB_0011bd04:
                *(ulong *)(&pCVar23->options + uVar28 * 2) = uVar22;
                *puVar21 = (ulong)((uint)*puVar21 & 1) | (ulong)pCVar23;
                *(byte *)&pCVar23->options = (byte)pCVar23->options | 1;
                *(byte *)puVar27 = (byte)*puVar27 & 0xfe;
                *(ulong *)(&pCVar16->options + uVar18 * 2) =
                     (ulong)((uint)*(undefined8 *)(&pCVar16->options + uVar18 * 2) & 1) |
                     (ulong)puVar27;
              }
              *(byte *)&pCVar17->options = (byte)pCVar17->options | 1;
              uVar26 = *puVar27;
              *puVar27 = uVar26 | 1;
              pbVar24 = (byte *)(uVar26 & 0xfffffffffffffffe);
              *pbVar24 = *pbVar24 & 0xfe;
              this = (JitAllocatorBlock *)puVar27[1];
              (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
              [0] = (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                    _rbNodeData[0] & 0xfffffffffffffffe;
              uVar18 = uStack_d0;
            }
          }
        }
        else if (((this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode.
                  _rbNodeData[0] & 1) == 0) {
          if ((this == (JitAllocatorBlock *)0x0) ||
             (((this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
               [0] & 1) == 0)) goto LAB_0011bbb8;
        }
        else {
          pCVar23 = (CreateParams *)
                    (*(ulong *)(&pCVar17->options + uVar28 * 2) & 0xfffffffffffffffe);
          *(ulong *)(&pCVar17->options + uVar28 * 2) =
               (ulong)((uint)*(ulong *)(&pCVar17->options + uVar28 * 2) & 1) |
               *(ulong *)(&pCVar23->options + uVar15 * 2) & 0xfffffffffffffffe;
          *(ulong *)(&pCVar23->options + uVar15 * 2) =
               (ulong)((uint)*(undefined8 *)(&pCVar23->options + uVar15 * 2) & 1) | (ulong)pCVar17;
          *(byte *)&pCVar17->options = (byte)pCVar17->options | 1;
          *(byte *)&pCVar23->options = (byte)pCVar23->options & 0xfe;
          this = (JitAllocatorBlock *)((ulong)((uint)*(undefined8 *)puVar29 & 1) | (ulong)pCVar23);
          *(JitAllocatorBlock **)puVar29 = this;
        }
      }
      puVar29 = &pCVar17->options + uVar15 * 2;
      pbVar24 = *(byte **)puVar29;
      uVar26 = uVar15;
      pCVar16 = pCVar23;
    } while ((byte *)0x1 < pbVar24);
  }
  if (pCVar13 == (CreateParams *)0x0) {
LAB_0011be77:
    ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
LAB_0011be7c:
    ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
  }
  else {
    if (pCVar13 == (CreateParams *)auStack_e8) goto LAB_0011be7c;
    if (pCVar17 != (CreateParams *)auStack_e8) {
      this = (JitAllocatorBlock *)(ulong)(pCVar17 == *(CreateParams **)&pCVar23->granularity);
      uVar4._0_4_ = pCVar17->options;
      uVar4._4_4_ = pCVar17->blockSize;
      *(ulong *)(&pCVar23->options + (long)this * 2) =
           (ulong)((uint)*(undefined8 *)(&pCVar23->options + (long)this * 2) & 1) |
           *(ulong *)(&pCVar17->options + (ulong)(uVar4 < 2) * 2) & 0xfffffffffffffffe;
      if (pCVar13 == pCVar17) {
LAB_0011be4e:
        (pJStack_c8->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData
        [0] = auStack_e8._8_8_;
        if ((byte *)auStack_e8._8_8_ != (byte *)0x0) {
          *(byte *)auStack_e8._8_8_ = *(byte *)auStack_e8._8_8_ & 0xfe;
        }
        return;
      }
      if (pCVar13 != pCVar12) {
        pCVar23 = pCVar12;
        if (pCVar12 == (CreateParams *)0x0) {
          pCVar23 = (CreateParams *)auStack_e8;
        }
        if (pCVar23 == (CreateParams *)auStack_e8) {
          uVar26 = 1;
        }
        else {
          pCVar16 = (CreateParams *)auStack_e8;
          if (pCVar12 != (CreateParams *)0x0) {
            pCVar16 = pCVar12;
          }
          uVar5._0_4_ = pCVar16[2].granularity;
          uVar5._4_4_ = pCVar16[2].fillPattern;
          uVar6._0_4_ = params[2].granularity;
          uVar6._4_4_ = params[2].fillPattern;
          uVar26 = (ulong)(uVar5 < uVar6);
        }
        this = *(JitAllocatorBlock **)(&pCVar23->options + uVar26 * 2);
        while (pCVar12 = (CreateParams *)((ulong)this & 0xfffffffffffffffe), pCVar13 != pCVar12) {
          if (pCVar12 == (CreateParams *)0x0) {
            ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
            goto LAB_0011be77;
          }
          uVar7._0_4_ = pCVar12[2].granularity;
          uVar7._4_4_ = pCVar12[2].fillPattern;
          uVar8._0_4_ = params[2].granularity;
          uVar8._4_4_ = params[2].fillPattern;
          uVar26 = (ulong)(uVar7 < uVar8);
          pCVar23 = pCVar12;
          this = *(JitAllocatorBlock **)(&pCVar12->options + uVar26 * 2);
        }
        *(ulong *)(&pCVar23->options + uVar26 * 2) = (ulong)((uint)this & 1) | (ulong)pCVar17;
        uVar11 = pCVar13->blockSize;
        pCVar17->options = pCVar13->options;
        pCVar17->blockSize = uVar11;
        uVar11 = pCVar13->fillPattern;
        pCVar17->granularity = pCVar13->granularity;
        pCVar17->fillPattern = uVar11;
        goto LAB_0011be4e;
      }
      goto LAB_0011be86;
    }
  }
  ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
LAB_0011be86:
  ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>();
  Target::Target((Target *)this);
  (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[0] =
       (uintptr_t)&PTR__JitRuntime_00159760;
  JitAllocator::JitAllocator
            ((JitAllocator *)&this->super_ZoneListNode<asmjit::JitAllocatorBlock>,params);
  (this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData[1] =
       0x203000002;
  *(undefined1 *)
   ((long)(this->super_ZoneTreeNodeT<asmjit::JitAllocatorBlock>).super_ZoneTreeNode._rbNodeData +
   0xd) = 1;
  return;
}

Assistant:

inline void markShrunkArea(uint32_t shrunkAreaStart, uint32_t shrunkAreaEnd) noexcept {
    uint32_t shrunkAreaSize = shrunkAreaEnd - shrunkAreaStart;

    // Shrunk area cannot start at zero as it would mean that we have shrunk the first
    // block to zero bytes, which is not allowed as such block must be released instead.
    ASMJIT_ASSERT(shrunkAreaStart != 0);
    ASMJIT_ASSERT(shrunkAreaSize != 0);

    // Update the search region and statistics.
    _pool->totalAreaUsed -= shrunkAreaSize;
    _areaUsed -= shrunkAreaSize;
    _searchStart = Support::min(_searchStart, shrunkAreaStart);
    _searchEnd = Support::max(_searchEnd, shrunkAreaEnd);

    // Unmark the released space and move the sentinel.
    Support::bitVectorClear(_usedBitVector, shrunkAreaStart, shrunkAreaSize);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaEnd - 1, false);
    Support::bitVectorSetBit(_stopBitVector, shrunkAreaStart - 1, true);

    addFlags(kFlagDirty);
  }